

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_20.cpp
# Opt level: O1

void __thiscall chrono::fea::ChElementHexaCorot_20::UpdateRotation(ChElementHexaCorot_20 *this)

{
  UpdateRotation((ChElementHexaCorot_20 *)
                 &this[-1].Material.
                  super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
  return;
}

Assistant:

void ChElementHexaCorot_20::UpdateRotation() {
    ChVector<> avgX1;
    avgX1 = nodes[0]->GetX0() + nodes[1]->GetX0() + nodes[2]->GetX0() + nodes[3]->GetX0();
    ChVector<> avgX2;
    avgX2 = nodes[4]->GetX0() + nodes[5]->GetX0() + nodes[6]->GetX0() + nodes[7]->GetX0();
    ChVector<> Xdir = avgX2 - avgX1;

    ChVector<> avgY1;
    avgY1 = nodes[0]->GetX0() + nodes[1]->GetX0() + nodes[4]->GetX0() + nodes[5]->GetX0();
    ChVector<> avgY2;
    avgY2 = nodes[2]->GetX0() + nodes[3]->GetX0() + nodes[6]->GetX0() + nodes[7]->GetX0();
    ChVector<> Ydir = avgY2 - avgY1;
    ChMatrix33<> rotX0;
    rotX0.Set_A_Xdir(Xdir.GetNormalized(), Ydir.GetNormalized());

    avgX1 = nodes[0]->pos + nodes[1]->pos + nodes[2]->pos + nodes[3]->pos;
    avgX2 = nodes[4]->pos + nodes[5]->pos + nodes[6]->pos + nodes[7]->pos;
    Xdir = avgX2 - avgX1;

    avgY1 = nodes[0]->pos + nodes[1]->pos + nodes[4]->pos + nodes[5]->pos;
    avgY2 = nodes[2]->pos + nodes[3]->pos + nodes[6]->pos + nodes[7]->pos;
    Ydir = avgY2 - avgY1;
    ChMatrix33<> rotXcurrent;
    rotXcurrent.Set_A_Xdir(Xdir.GetNormalized(), Ydir.GetNormalized());

    this->A = rotXcurrent * rotX0.transpose();
}